

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::StaleFileRemovalCommand::getVerboseDescription
          (StaleFileRemovalCommand *this,SmallVectorImpl<char> *result)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  size_t in_RCX;
  long *plVar4;
  pointer pbVar5;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileToDelete;
  long *local_90;
  void *local_88;
  long local_80 [2];
  pointer local_70;
  StaleFileRemovalCommand *local_68;
  raw_ostream local_60;
  SmallVectorImpl<char> *local_38;
  
  computeFilesToDelete(this);
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[3])(this,result);
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
  local_38 = result;
  llvm::raw_ostream::SetUnbuffered(&local_60);
  Str.Length = 0x10;
  Str.Data = ", stale files: [";
  llvm::raw_ostream::operator<<(&local_60,Str);
  llvm::raw_ostream::~raw_ostream(&local_60);
  pbVar5 = (this->filesToDelete).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (this->filesToDelete).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  if (pbVar5 != local_70) {
    do {
      local_90 = local_80;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + pbVar5->_M_string_length);
      local_60.BufferMode = InternalBuffer;
      local_60.OutBufStart = (char *)0x0;
      local_60.OutBufEnd = (char *)0x0;
      local_60.OutBufCur = (char *)0x0;
      local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
      local_38 = result;
      llvm::raw_ostream::SetUnbuffered(&local_60);
      llvm::raw_ostream::write(&local_60,(int)local_90,local_88,in_RCX);
      llvm::raw_ostream::~raw_ostream(&local_60);
      plVar4 = local_90;
      pbVar2 = (local_68->filesToDelete).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88 == (void *)pbVar2[-1]._M_string_length) {
        if (local_88 != (void *)0x0) {
          iVar3 = bcmp(local_90,pbVar2[-1]._M_dataplus._M_p,(size_t)local_88);
          if (iVar3 != 0) goto LAB_001943f6;
        }
      }
      else {
LAB_001943f6:
        local_60.BufferMode = InternalBuffer;
        local_60.OutBufStart = (char *)0x0;
        local_60.OutBufEnd = (char *)0x0;
        local_60.OutBufCur = (char *)0x0;
        local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
        local_38 = result;
        llvm::raw_ostream::SetUnbuffered(&local_60);
        Str_00.Length = 2;
        Str_00.Data = ", ";
        llvm::raw_ostream::operator<<(&local_60,Str_00);
        llvm::raw_ostream::~raw_ostream(&local_60);
        plVar4 = local_90;
      }
      if (plVar4 != local_80) {
        operator_delete(plVar4,local_80[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_70);
  }
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
  local_38 = result;
  llvm::raw_ostream::SetUnbuffered(&local_60);
  Str_01.Length = 0xb;
  Str_01.Data = "], roots: [";
  llvm::raw_ostream::operator<<(&local_60,Str_01);
  llvm::raw_ostream::~raw_ostream(&local_60);
  pbVar5 = (local_68->roots).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_68->roots).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != local_70) {
    do {
      local_90 = local_80;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + pbVar5->_M_string_length);
      local_60.BufferMode = InternalBuffer;
      local_60.OutBufStart = (char *)0x0;
      local_60.OutBufEnd = (char *)0x0;
      local_60.OutBufCur = (char *)0x0;
      local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
      local_38 = result;
      llvm::raw_ostream::SetUnbuffered(&local_60);
      llvm::raw_ostream::write(&local_60,(int)local_90,local_88,in_RCX);
      llvm::raw_ostream::~raw_ostream(&local_60);
      plVar4 = local_90;
      pbVar2 = (local_68->roots).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88 == (void *)pbVar2[-1]._M_string_length) {
        if (local_88 != (void *)0x0) {
          iVar3 = bcmp(local_90,pbVar2[-1]._M_dataplus._M_p,(size_t)local_88);
          if (iVar3 != 0) goto LAB_0019456e;
        }
      }
      else {
LAB_0019456e:
        local_60.BufferMode = InternalBuffer;
        local_60.OutBufStart = (char *)0x0;
        local_60.OutBufEnd = (char *)0x0;
        local_60.OutBufCur = (char *)0x0;
        local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
        local_38 = result;
        llvm::raw_ostream::SetUnbuffered(&local_60);
        Str_02.Length = 2;
        Str_02.Data = ", ";
        llvm::raw_ostream::operator<<(&local_60,Str_02);
        llvm::raw_ostream::~raw_ostream(&local_60);
        plVar4 = local_90;
      }
      if (plVar4 != local_80) {
        operator_delete(plVar4,local_80[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_70);
  }
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
  local_38 = result;
  llvm::raw_ostream::SetUnbuffered(&local_60);
  Str_03.Length = 1;
  Str_03.Data = "]";
  llvm::raw_ostream::operator<<(&local_60,Str_03);
  llvm::raw_ostream::~raw_ostream(&local_60);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    computeFilesToDelete();

    getShortDescription(result);
    llvm::raw_svector_ostream(result) << ", stale files: [";
    for (auto fileToDelete : filesToDelete) {
      llvm::raw_svector_ostream(result) << fileToDelete;
      if (fileToDelete != *(--filesToDelete.end())) {
        llvm::raw_svector_ostream(result) << ", ";
      }
    }
    llvm::raw_svector_ostream(result) << "], roots: [";
    for (auto root : roots) {
      llvm::raw_svector_ostream(result) << root;
      if (root != *(--roots.end())) {
        llvm::raw_svector_ostream(result) << ", ";
      }
    }
    llvm::raw_svector_ostream(result) << "]";
  }